

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PredicateSplitPassiveClauseContainers.cpp
# Opt level: O0

bool __thiscall
Saturation::PredicateSplitPassiveClauseContainer::exceedsWeightLimit
          (PredicateSplitPassiveClauseContainer *this,uint w,uint numPositiveLiterals,
          Inference *inference)

{
  uint uVar1;
  size_type sVar2;
  pointer pPVar3;
  undefined8 in_RCX;
  uint in_EDX;
  uint in_ESI;
  long *in_RDI;
  value_type *queue;
  uint i;
  uint bestQueueIndex;
  PredicateSplitPassiveClauseContainer *in_stack_ffffffffffffffd0;
  uint local_28;
  
  (**(code **)(*in_RDI + 0xa8))(in_RDI,in_EDX,in_RCX);
  local_28 = bestQueue(in_stack_ffffffffffffffd0,(float)((ulong)in_RDI >> 0x20));
  while( true ) {
    sVar2 = std::
            vector<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>,_std::allocator<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>_>_>
            ::size((vector<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>,_std::allocator<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>_>_>
                    *)(in_RDI + 0x10));
    if (sVar2 <= local_28) {
      return true;
    }
    std::
    vector<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>,_std::allocator<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>_>_>
    ::operator[]((vector<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>,_std::allocator<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>_>_>
                  *)(in_RDI + 0x10),(ulong)local_28);
    pPVar3 = std::
             unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>
             ::operator->((unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>
                           *)0xaca6a5);
    uVar1 = (*(pPVar3->super_RandomAccessClauseContainer).super_ClauseContainer.
              _vptr_ClauseContainer[0x11])(pPVar3,(ulong)in_ESI,(ulong)in_EDX,in_RCX);
    if ((uVar1 & 1) == 0) break;
    local_28 = local_28 + 1;
  }
  return false;
}

Assistant:

bool PredicateSplitPassiveClauseContainer::exceedsWeightLimit(unsigned w, unsigned numPositiveLiterals, const Inference& inference) const
{
  auto bestQueueIndex = bestQueue(evaluateFeatureEstimate(numPositiveLiterals, inference));
  // note: even for non-layered-arrangements, we need to go through all queues, since the values for age, w, ... are only lower bounds (in the sense that the actual value could lead to a worse bestQueueIndex)
  for (unsigned i = bestQueueIndex; i < _queues.size(); i++)
  {
    auto& queue = _queues[i];
    if (!queue->exceedsWeightLimit(w, numPositiveLiterals, inference))
    {
      return false;
    }
  }
  return true;
}